

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToDrawData(ImVector<ImDrawList_*> *out_render_list,ImGuiWindow *window)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  ImVector<ImDrawList_*> *in_RSI;
  ImGuiWindow *child;
  int i;
  ImGuiContext *g;
  ImDrawList *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int i_00;
  ImGuiContext *window_00;
  
  window_00 = GImGui;
  (GImGui->IO).MetricsRenderWindows = (GImGui->IO).MetricsRenderWindows + 1;
  AddDrawListToDrawData
            ((ImVector<ImDrawList_*> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffd8);
  for (i_00 = 0; i_00 < in_RSI[0x19].Size; i_00 = i_00 + 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)(in_RSI + 0x19),i_00);
    bVar1 = IsWindowActiveAndVisible(*ppIVar2);
    if (bVar1) {
      AddWindowToDrawData(in_RSI,(ImGuiWindow *)window_00);
    }
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImVector<ImDrawList*>* out_render_list, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(out_render_list, window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // clipped children may have been marked not active
            AddWindowToDrawData(out_render_list, child);
    }
}